

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O2

void __thiscall
cs::statement_struct::statement_struct
          (statement_struct *this,string *name,tree_type<cs::token_base_*> *tree,
          deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *method,context_t *c,
          token_base *ptr)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  tree_type<cs::token_base_*> local_d0;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_c8;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_b8;
  string local_a0;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_80;
  
  std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_b8,&c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>);
  _Var1._M_pi = local_b8._M_refcount._M_pi;
  (this->super_statement_base)._vptr_statement_base = (_func_int **)&PTR__statement_base_00249528;
  local_b8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_statement_base).context.
  super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_b8._M_ptr;
  (this->super_statement_base).context.
  super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  local_b8._M_ptr = (element_type *)0x0;
  (this->super_statement_base).line_num = ptr->line_num;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
  (this->super_statement_base)._vptr_statement_base = (_func_int **)&PTR__statement_struct_0024a720;
  std::__cxx11::string::string((string *)&this->mName,(string *)name);
  std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_c8,&c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::string((string *)&local_a0,(string *)name);
  tree_type<cs::token_base_*>::tree_type(&local_d0,tree);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_80,method)
  ;
  struct_builder::struct_builder
            (&this->mBuilder,(context_t *)&local_c8,&local_a0,&local_d0,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_80);
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
            (&local_80);
  tree_type<cs::token_base_*>::~tree_type(&local_d0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
  tree_type<cs::token_base_*>::tree_type(&this->mParent,tree);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            (&this->mBlock,method);
  return;
}

Assistant:

statement_struct(const std::string &name, const tree_type<token_base *> &tree,
		                 const std::deque<statement_base *> &method, const context_t &c, token_base *ptr)
			: statement_base(c,
			                 ptr),
			  mName(name),
			  mBuilder(c, name,
			           tree,
			           method),
			  mParent(tree),
			  mBlock(method) {}